

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall
QPDFWriter::activatePipelineStack
          (QPDFWriter *this,PipelinePopper *pp,bool discard,string *str,
          unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link)

{
  unsigned_long *puVar1;
  Link *pLVar2;
  element_type *peVar3;
  unsigned_long uVar4;
  Pipeline *next;
  Count *pCVar5;
  Count *c;
  Count *local_50;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_48;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_40;
  PipelinePopper *local_38;
  
  pLVar2 = (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>.
           _M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
  if (pLVar2 == (Link *)0x0) {
    if (discard) {
      pCVar5 = (Count *)operator_new(0x58);
      uVar4 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->next_stack_id;
      Pipeline::Pipeline((Pipeline *)pCVar5,"",(Pipeline *)0x0);
      (pCVar5->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002ee298;
      pCVar5->count = 0;
      pCVar5->str = (string *)0x0;
      (pCVar5->link)._M_t.
      super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
      pCVar5->id_ = uVar4;
      pCVar5->pass_immediately_to_next = false;
      local_50 = pCVar5;
    }
    else {
      pCVar5 = (Count *)operator_new(0x58);
      peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar4 = peVar3->next_stack_id;
      local_50 = pCVar5;
      if (str == (string *)0x0) {
        next = (*(pointer *)
                 ((long)&(peVar3->pipeline_stack).
                         super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
                         super__Vector_impl_data + 8))[-1];
        Pipeline::Pipeline((Pipeline *)pCVar5,"",next);
        (pCVar5->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002ee298;
        pCVar5->count = 0;
        pCVar5->str = (string *)0x0;
        (pCVar5->link)._M_t.
        super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
        super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
        super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
        pCVar5->id_ = uVar4;
        pCVar5->pass_immediately_to_next = next != (Pipeline *)0x0;
      }
      else {
        local_48._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
        .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
             (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
             (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
        Pipeline::Pipeline((Pipeline *)pCVar5,"",(Pipeline *)0x0);
        (pCVar5->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002ee298;
        pCVar5->count = 0;
        pCVar5->str = str;
        (pCVar5->link)._M_t.
        super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
        super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
        super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
        local_48._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
        .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
             (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
             (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
        pCVar5->id_ = uVar4;
        pCVar5->pass_immediately_to_next = false;
        std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                  ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_48);
      }
    }
  }
  else {
    local_38 = pp;
    pCVar5 = (Count *)operator_new(0x58);
    peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar4 = peVar3->next_stack_id;
    (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
    local_40._M_head_impl = pLVar2;
    Pipeline::Pipeline((Pipeline *)pCVar5,"",
                       (Pipeline *)
                       (pLVar2->next_pl)._M_t.
                       super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>);
    (pCVar5->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002ee298;
    pCVar5->count = 0;
    pCVar5->str = &peVar3->count_buffer;
    (pCVar5->link)._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>.
    _M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = pLVar2;
    local_40._M_head_impl = (Link *)0x0;
    pCVar5->id_ = uVar4;
    pCVar5->pass_immediately_to_next = false;
    local_50 = pCVar5;
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
              ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_40);
    pp = local_38;
  }
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pp->stack_id = peVar3->next_stack_id;
  std::vector<Pipeline*,std::allocator<Pipeline*>>::emplace_back<qpdf::pl::Count*&>
            ((vector<Pipeline*,std::allocator<Pipeline*>> *)&peVar3->pipeline_stack,&local_50);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar3->pipeline = local_50;
  puVar1 = &peVar3->next_stack_id;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void
QPDFWriter::activatePipelineStack(
    PipelinePopper& pp, bool discard, std::string* str, std::unique_ptr<pl::Link> link)
{
    pl::Count* c;
    if (link) {
        c = new pl::Count(m->next_stack_id, m->count_buffer, std::move(link));
    } else if (discard) {
        c = new pl::Count(m->next_stack_id, nullptr);
    } else if (!str) {
        c = new pl::Count(m->next_stack_id, m->pipeline_stack.back());
    } else {
        c = new pl::Count(m->next_stack_id, *str);
    }
    pp.stack_id = m->next_stack_id;
    m->pipeline_stack.emplace_back(c);
    m->pipeline = c;
    ++m->next_stack_id;
}